

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

VkResult __thiscall
VmaAllocator_T::AllocateDedicatedMemoryPage
          (VmaAllocator_T *this,VmaPool pool,VkDeviceSize size,VmaSuballocationType suballocType,
          uint32_t memTypeIndex,VkMemoryAllocateInfo *allocInfo,bool map,bool isUserDataString,
          bool isMappingAllowed,void *pUserData,VmaAllocation *pAllocation)

{
  atomic<unsigned_int> *paVar1;
  atomic<unsigned_long> *paVar2;
  uint uVar3;
  VkResult VVar4;
  VmaAllocation this_00;
  bool isMappingAllowed_local;
  VkDeviceMemory hMemory;
  void *pMappedData;
  
  isMappingAllowed_local = isMappingAllowed;
  hMemory = (VkDeviceMemory)0x0;
  VVar4 = AllocateVulkanMemory(this,allocInfo,&hMemory);
  if (VK_ERROR_OUT_OF_HOST_MEMORY < VVar4) {
    pMappedData = (void *)0x0;
    if ((map) && (VVar4 = (*(this->m_VulkanFunctions).vkMapMemory)
                                    (this->m_hDevice,hMemory,0,0xffffffffffffffff,0,&pMappedData),
                 VVar4 < VK_SUCCESS)) {
      FreeVulkanMemory(this,memTypeIndex,size,hMemory);
    }
    else {
      this_00 = VmaAllocationObjectAllocator::Allocate<bool&>
                          (&this->m_AllocationObjectAllocator,&isMappingAllowed_local);
      *pAllocation = this_00;
      VmaAllocation_T::InitDedicatedAllocation
                (this_00,pool,memTypeIndex,hMemory,suballocType,pMappedData,size);
      if (isUserDataString) {
        VmaAllocation_T::SetName(*pAllocation,this,(char *)pUserData);
      }
      else {
        (*pAllocation)->m_pUserData = pUserData;
      }
      uVar3 = (this->m_MemProps).memoryTypes[memTypeIndex].heapIndex;
      LOCK();
      paVar2 = (this->m_Budget).m_AllocationBytes + uVar3;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i + size;
      UNLOCK();
      LOCK();
      paVar1 = (this->m_Budget).m_AllocationCount + uVar3;
      (paVar1->super___atomic_base<unsigned_int>)._M_i =
           (paVar1->super___atomic_base<unsigned_int>)._M_i + 1;
      UNLOCK();
      LOCK();
      paVar1 = &(this->m_Budget).m_OperationsSinceBudgetFetch;
      (paVar1->super___atomic_base<unsigned_int>)._M_i =
           (paVar1->super___atomic_base<unsigned_int>)._M_i + 1;
      UNLOCK();
      VVar4 = VK_SUCCESS;
    }
  }
  return VVar4;
}

Assistant:

VkResult VmaAllocator_T::AllocateDedicatedMemoryPage(
    VmaPool pool,
    VkDeviceSize size,
    VmaSuballocationType suballocType,
    uint32_t memTypeIndex,
    const VkMemoryAllocateInfo& allocInfo,
    bool map,
    bool isUserDataString,
    bool isMappingAllowed,
    void* pUserData,
    VmaAllocation* pAllocation)
{
    VkDeviceMemory hMemory = VK_NULL_HANDLE;
    VkResult res = AllocateVulkanMemory(&allocInfo, &hMemory);
    if(res < 0)
    {
        VMA_DEBUG_LOG("    vkAllocateMemory FAILED");
        return res;
    }

    void* pMappedData = VMA_NULL;
    if(map)
    {
        res = (*m_VulkanFunctions.vkMapMemory)(
            m_hDevice,
            hMemory,
            0,
            VK_WHOLE_SIZE,
            0,
            &pMappedData);
        if(res < 0)
        {
            VMA_DEBUG_LOG("    vkMapMemory FAILED");
            FreeVulkanMemory(memTypeIndex, size, hMemory);
            return res;
        }
    }

    *pAllocation = m_AllocationObjectAllocator.Allocate(isMappingAllowed);
    (*pAllocation)->InitDedicatedAllocation(pool, memTypeIndex, hMemory, suballocType, pMappedData, size);
    if (isUserDataString)
        (*pAllocation)->SetName(this, (const char*)pUserData);
    else
        (*pAllocation)->SetUserData(this, pUserData);
    m_Budget.AddAllocation(MemoryTypeIndexToHeapIndex(memTypeIndex), size);
    if(VMA_DEBUG_INITIALIZE_ALLOCATIONS)
    {
        FillAllocation(*pAllocation, VMA_ALLOCATION_FILL_PATTERN_CREATED);
    }

    return VK_SUCCESS;
}